

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O2

int __thiscall capnp::TwoPartyServer::listen(TwoPartyServer *this,int __fd,int __n)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  ErrorHandler EVar2;
  void *pvVar3;
  undefined4 in_register_00000014;
  ConnectionReceiver *pCVar4;
  undefined4 in_register_00000034;
  SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_twoparty_c__:428:13)>
  *location_00;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_70;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_68;
  code *local_60;
  anon_class_16_2_8321eaef_for_func local_58;
  ErrorHandler local_48;
  undefined *local_40;
  undefined *puStack_38;
  undefined8 local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  pCVar4 = (ConnectionReceiver *)CONCAT44(in_register_00000014,__n);
  (**pCVar4->_vptr_ConnectionReceiver)(&local_70,pCVar4);
  local_60 = kj::_::
             SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty.c++:428:13)>
             ::anon_class_16_2_8321eaef_for_func::operator();
  pPVar1 = ((local_70.ptr)->super_PromiseArenaMember).arena;
  local_58.this = (TwoPartyServer *)CONCAT44(in_register_00000034,__fd);
  local_58.listener = pCVar4;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_70.ptr - (long)pPVar1) < 0x30) {
    pvVar3 = operator_new(0x400);
    location_00 = (SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_twoparty_c__:428:13)>
                   *)((long)pvVar3 + 0x3d0);
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,decltype(nullptr)>,capnp::TwoPartyServer::listen(kj::ConnectionReceiver&)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::TwoPartyServer::listen(kj::ConnectionReceiver&)::__0,void*&>
              (location_00,&local_70,&local_58,&local_60);
    *(void **)((long)pvVar3 + 0x3d8) = pvVar3;
  }
  else {
    ((local_70.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_00 = (SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_twoparty_c__:428:13)>
                   *)(local_70.ptr + -3);
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,decltype(nullptr)>,capnp::TwoPartyServer::listen(kj::ConnectionReceiver&)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::TwoPartyServer::listen(kj::ConnectionReceiver&)::__0,void*&>
              (location_00,&local_70,&local_58,&local_60);
    local_70.ptr[-3].super_PromiseArenaMember.arena = pPVar1;
  }
  local_40 = &DAT_0042a172;
  puStack_38 = &DAT_0042a1d1;
  local_30 = 0x4c0000058b;
  location.function = &DAT_0042a1d1;
  location.fileName = &DAT_0042a172;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  local_68.ptr = (PromiseNode *)location_00;
  kj::_::maybeChain<void>((OwnPromiseNode *)&local_48,(Promise<void> *)&local_68,location);
  EVar2._vptr_ErrorHandler = local_48._vptr_ErrorHandler;
  local_48._vptr_ErrorHandler = (_func_int **)0x0;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_48);
  (this->super_ErrorHandler)._vptr_ErrorHandler = EVar2._vptr_ErrorHandler;
  local_28.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_68);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_70);
  return (int)this;
}

Assistant:

kj::Promise<void> TwoPartyServer::listen(kj::ConnectionReceiver& listener) {
  return listener.accept()
      .then([this,&listener](kj::Own<kj::AsyncIoStream>&& connection) mutable {
    accept(kj::mv(connection));
    return listen(listener);
  });
}